

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraKateGenerator::CreateDummyKateProjectFile(cmExtraKateGenerator *this,cmLocalGenerator *lg)

{
  byte bVar1;
  string *psVar2;
  ostream *poVar3;
  undefined1 local_300 [8];
  cmGeneratedFileStream fout;
  cmAlphaNum local_68;
  undefined1 local_38 [8];
  string filename;
  cmLocalGenerator *lg_local;
  cmExtraKateGenerator *this_local;
  
  filename.field_2._8_8_ = lg;
  psVar2 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
  cmAlphaNum::cmAlphaNum(&local_68,psVar2);
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&fout.field_0x260,'/');
  cmStrCat<std::__cxx11::string,char[13]>
            ((string *)local_38,&local_68,(cmAlphaNum *)&fout.field_0x260,&this->ProjectName,
             (char (*) [13])0xd60d0e);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_300,(string *)local_38,false,None);
  bVar1 = std::ios::operator!((ios *)(local_300 + (long)*(_func_int **)((long)local_300 + -0x18)));
  if ((bVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)local_300,"#Generated by ");
    psVar2 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,(string *)psVar2);
    std::operator<<(poVar3,", do not edit.\n");
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_300);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmExtraKateGenerator::CreateDummyKateProjectFile(
  const cmLocalGenerator& lg) const
{
  std::string filename =
    cmStrCat(lg.GetBinaryDirectory(), '/', this->ProjectName, ".kateproject");
  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  fout << "#Generated by " << cmSystemTools::GetCMakeCommand()
       << ", do not edit.\n";
}